

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimeGenerator.cpp
# Opt level: O0

void __thiscall primesieve::PrimeGenerator::initErat(PrimeGenerator *this)

{
  uint64_t uVar1;
  unsigned_long *puVar2;
  Erat *in_RDI;
  int sieveSize;
  uint64_t startErat;
  EVP_PKEY_CTX *local_10 [2];
  
  uVar1 = maxCachedPrime();
  local_10[0] = (EVP_PKEY_CTX *)(uVar1 + 1);
  puVar2 = std::max<unsigned_long>((unsigned_long *)local_10,&in_RDI->start_);
  local_10[0] = (EVP_PKEY_CTX *)*puVar2;
  *(undefined1 *)
   &in_RDI[3].eratMedium_.memoryPool_.memory_.
    super__Vector_base<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 1;
  if (local_10[0] <= (EVP_PKEY_CTX *)in_RDI->stop_) {
    get_sieve_size();
    Erat::init(in_RDI,local_10[0]);
    SievingPrimes::init((SievingPrimes *)&in_RDI[1].deleter_,(EVP_PKEY_CTX *)in_RDI);
  }
  return;
}

Assistant:

void PrimeGenerator::initErat()
{
  uint64_t startErat = maxCachedPrime() + 1;
  startErat = max(startErat, start_);
  isInit_ = true;

  if (startErat <= stop_)
  {
    int sieveSize = get_sieve_size();
    Erat::init(startErat, stop_, sieveSize, preSieve_);
    sievingPrimes_.init(this, preSieve_);
  }
}